

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O0

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_join
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,
          vertex_dist *v2,double len1,double len2)

{
  line_join_e lVar1;
  bool bVar2;
  double dbevel_00;
  double local_98;
  double dbevel;
  double dy;
  double dx;
  double limit;
  double cp;
  double dy2;
  double dx2;
  double dy1;
  double dx1;
  double len2_local;
  double len1_local;
  vertex_dist *v2_local;
  vertex_dist *v1_local;
  vertex_dist *v0_local;
  pod_bvector<agg::point_base<double>,_6U> *vc_local;
  math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this_local;
  
  dy1 = (this->m_width * (v1->y - v0->y)) / len1;
  dx2 = (this->m_width * (v1->x - v0->x)) / len1;
  dy2 = (this->m_width * (v2->y - v1->y)) / len2;
  cp = (this->m_width * (v2->x - v1->x)) / len2;
  dx1 = len2;
  len2_local = len1;
  len1_local = (double)v2;
  v2_local = v1;
  v1_local = v0;
  v0_local = (vertex_dist *)vc;
  vc_local = (pod_bvector<agg::point_base<double>,_6U> *)this;
  pod_bvector<agg::point_base<double>,_6U>::remove_all(vc);
  limit = cross_product(v1_local->x,v1_local->y,v2_local->x,v2_local->y,*(double *)len1_local,
                        *(double *)((long)len1_local + 8));
  if (((limit == 0.0) && (!NAN(limit))) || (0.0 < limit != 0.0 < this->m_width)) {
    dy = (dy1 + dy2) / 2.0;
    dbevel = (dx2 + cp) / 2.0;
    dbevel_00 = sqrt(dy * dy + dbevel * dbevel);
    if (((this->m_line_join != round_join) && (this->m_line_join != bevel_join)) ||
       (this->m_width_eps <= this->m_approx_scale * (this->m_width_abs - dbevel_00))) {
      lVar1 = this->m_line_join;
      if (miter_join_revert < lVar1) {
        if (lVar1 == round_join) {
          calc_arc(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x,v2_local->y
                   ,dy1,-dx2,dy2,-cp);
          return;
        }
        if (lVar1 != miter_join_round) {
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy1,
                     v2_local->y - dx2);
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy2,
                     v2_local->y - cp);
          return;
        }
      }
      calc_miter(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v1_local,v2_local,
                 (vertex_dist *)len1_local,dy1,dx2,dy2,cp,this->m_line_join,this->m_miter_limit,
                 dbevel_00);
    }
    else {
      bVar2 = calc_intersection(v1_local->x + dy1,v1_local->y - dx2,v2_local->x + dy1,
                                v2_local->y - dx2,v2_local->x + dy2,v2_local->y - cp,
                                *(double *)len1_local + dy2,*(double *)((long)len1_local + 8) - cp,
                                &dy,&dbevel);
      if (bVar2) {
        add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,dy,dbevel);
      }
      else {
        add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy1,
                   v2_local->y - dx2);
      }
    }
  }
  else {
    if (dx1 <= len2_local) {
      local_98 = dx1;
    }
    else {
      local_98 = len2_local;
    }
    dx = local_98 / this->m_width_abs;
    if (dx < this->m_inner_miter_limit) {
      dx = this->m_inner_miter_limit;
    }
    if (this->m_inner_join == inner_miter) {
      calc_miter(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v1_local,v2_local,
                 (vertex_dist *)len1_local,dy1,dx2,dy2,cp,miter_join_revert,dx,0.0);
    }
    else if (this->m_inner_join - inner_jag < 2) {
      limit = (dy1 - dy2) * (dy1 - dy2) + (dx2 - cp) * (dx2 - cp);
      if ((len2_local * len2_local <= limit) || (dx1 * dx1 <= limit)) {
        if (this->m_inner_join == inner_jag) {
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy1,
                     v2_local->y - dx2);
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x,
                     v2_local->y);
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy2,
                     v2_local->y - cp);
        }
        else {
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy1,
                     v2_local->y - dx2);
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x,
                     v2_local->y);
          calc_arc(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x,v2_local->y
                   ,dy2,-cp,dy1,-dx2);
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x,
                     v2_local->y);
          add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy2,
                     v2_local->y - cp);
        }
      }
      else {
        calc_miter(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v1_local,v2_local,
                   (vertex_dist *)len1_local,dy1,dx2,dy2,cp,miter_join_revert,dx,0.0);
      }
    }
    else {
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy1,
                 v2_local->y - dx2);
      add_vertex(this,(pod_bvector<agg::point_base<double>,_6U> *)v0_local,v2_local->x + dy2,
                 v2_local->y - cp);
    }
  }
  return;
}

Assistant:

void math_stroke<VC>::calc_join(VC& vc,
                                    const vertex_dist& v0, 
                                    const vertex_dist& v1, 
                                    const vertex_dist& v2,
                                    double len1, 
                                    double len2)
    {
        double dx1 = m_width * (v1.y - v0.y) / len1;
        double dy1 = m_width * (v1.x - v0.x) / len1;
        double dx2 = m_width * (v2.y - v1.y) / len2;
        double dy2 = m_width * (v2.x - v1.x) / len2;

        vc.remove_all();

        double cp = cross_product(v0.x, v0.y, v1.x, v1.y, v2.x, v2.y);
        if(cp != 0 && (cp > 0) == (m_width > 0))
        {
            // Inner join
            //---------------
            double limit = ((len1 < len2) ? len1 : len2) / m_width_abs;
            if(limit < m_inner_miter_limit)
            {
                limit = m_inner_miter_limit;
            }

            switch(m_inner_join)
            {
            default: // inner_bevel
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;

            case inner_miter:
                calc_miter(vc,
                           v0, v1, v2, dx1, dy1, dx2, dy2, 
                           miter_join_revert, 
                           limit, 0);
                break;

            case inner_jag:
            case inner_round:
                cp = (dx1-dx2) * (dx1-dx2) + (dy1-dy2) * (dy1-dy2);
                if(cp < len1 * len1 && cp < len2 * len2)
                {
                    calc_miter(vc,
                               v0, v1, v2, dx1, dy1, dx2, dy2, 
                               miter_join_revert, 
                               limit, 0);
                }
                else
                {
                    if(m_inner_join == inner_jag)
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        add_vertex(vc, v1.x + dx2, v1.y - dy2);
                    }
                    else
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        calc_arc(vc, v1.x, v1.y, dx2, -dy2, dx1, -dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        add_vertex(vc, v1.x + dx2, v1.y - dy2);
                    }
                }
                break;
            }
        }
        else
        {
            // Outer join
            //---------------

            // Calculate the distance between v1 and 
            // the central point of the bevel line segment
            //---------------
            double dx = (dx1 + dx2) / 2;
            double dy = (dy1 + dy2) / 2;
            double dbevel = sqrt(dx * dx + dy * dy);

            if(m_line_join == round_join || m_line_join == bevel_join)
            {
                // This is an optimization that reduces the number of points 
                // in cases of almost collinear segments. If there's no
                // visible difference between bevel and miter joins we'd rather
                // use miter join because it adds only one point instead of two. 
                //
                // Here we calculate the middle point between the bevel points 
                // and then, the distance between v1 and this middle point. 
                // At outer joins this distance always less than stroke width, 
                // because it's actually the height of an isosceles triangle of
                // v1 and its two bevel points. If the difference between this
                // width and this value is small (no visible bevel) we can 
                // add just one point. 
                //
                // The constant in the expression makes the result approximately 
                // the same as in round joins and caps. You can safely comment 
                // out this entire "if".
                //-------------------
                if(m_approx_scale * (m_width_abs - dbevel) < m_width_eps)
                {
                    if(calc_intersection(v0.x + dx1, v0.y - dy1,
                                         v1.x + dx1, v1.y - dy1,
                                         v1.x + dx2, v1.y - dy2,
                                         v2.x + dx2, v2.y - dy2,
                                         &dx, &dy))
                    {
                        add_vertex(vc, dx, dy);
                    }
                    else
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                    }
                    return;
                }
            }

            switch(m_line_join)
            {
            case miter_join:
            case miter_join_revert:
            case miter_join_round:
                calc_miter(vc, 
                           v0, v1, v2, dx1, dy1, dx2, dy2, 
                           m_line_join, 
                           m_miter_limit,
                           dbevel);
                break;

            case round_join:
                calc_arc(vc, v1.x, v1.y, dx1, -dy1, dx2, -dy2);
                break;

            default: // Bevel join
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;
            }
        }
    }